

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall RDNSequence::SetDataSize(RDNSequence *this)

{
  size_type sVar1;
  reference this_00;
  size_t sVar2;
  size_t cbName;
  size_t i;
  size_t cbNeeded;
  RDNSequence *this_local;
  
  i = 0;
  cbName = 0;
  while( true ) {
    sVar1 = std::vector<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>::size
                      (&this->name);
    if (sVar1 <= cbName) break;
    this_00 = std::vector<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>::
              operator[](&this->name,cbName);
    sVar2 = DerBase::EncodedSize(&this_00->super_DerBase);
    i = sVar2 + i;
    cbName = cbName + 1;
  }
  (this->super_DerBase).cbData = i;
  return i;
}

Assistant:

virtual size_t SetDataSize() override
	{
        size_t cbNeeded = 0; 

        // First, calculate how much is needed for the set of names
        for (size_t i = 0; i < name.size(); ++i)
        {
            size_t cbName = name[i].EncodedSize();
            cbNeeded += cbName;
        }

        return (cbData = cbNeeded);
    }